

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall
ORPG::Character::Character
          (Character *this,Race *racePtr,AbilityScores *ab,CharacterClass *classPtr,int bgID,
          Skills *sk,string *name)

{
  Background *pBVar1;
  ulong uVar2;
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  NameGenerator local_c8 [8];
  NameGenerator ng;
  Skills *sk_local;
  int bgID_local;
  CharacterClass *classPtr_local;
  AbilityScores *ab_local;
  Race *racePtr_local;
  Character *this_local;
  
  this->race = racePtr;
  this->abils = ab;
  this->cClass = classPtr;
  this->skills = sk;
  std::__cxx11::string::string((string *)&this->firstName);
  std::__cxx11::string::string((string *)&this->lastName);
  std::vector<ORPG::Language,_std::allocator<ORPG::Language>_>::vector(&this->langs);
  pBVar1 = background_selector(bgID);
  this->bg = pBVar1;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->firstName,(string *)name);
    std::__cxx11::string::operator=((string *)&this->lastName,(string *)name);
  }
  else {
    (*this->race->_vptr_Race[3])(local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"",&local_109);
    ORPG::NameGenerator::NameGenerator(local_c8,local_e8,local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string(local_e8);
    ORPG::NameGenerator::make_first_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->firstName,local_130);
    std::__cxx11::string::~string(local_130);
    ORPG::NameGenerator::make_last_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->lastName,local_150);
    std::__cxx11::string::~string(local_150);
    NameGenerator::~NameGenerator(local_c8);
  }
  Initialize(this);
  return;
}

Assistant:

Character::Character(Race* racePtr, AbilityScores* ab, CharacterClass* classPtr,
                        const int bgID, Skills* sk, std::string name):
                        race(racePtr), abils(ab), cClass(classPtr), skills(sk) {
        bg = background_selector(bgID);

        if(name.empty()) {
            NameGenerator ng(race->to_string());

            firstName = ng.make_first();
            lastName = ng.make_last();
        } else {
            /* TODO make this work by parsing the name into a first and last */
            firstName = name;
            lastName = name;
        }

        Initialize();
    }